

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_list_graph.c
# Opt level: O0

ClgGraph createClgGraph(Vertices vertices,Edges edges,int countOfVertex,int countOfEdge,
                       GraphKind kind)

{
  ClgGraph clgGraph;
  GraphKind kind_local;
  int countOfEdge_local;
  int countOfVertex_local;
  Edges edges_local;
  Vertices vertices_local;
  
  if (kind == DG) {
    vertices_local = (Vertices)createGraph_CLG(vertices,edges,countOfVertex,countOfEdge,false);
    if ((ClgGraph)vertices_local != (ClgGraph)0x0) {
      ((ClgGraph)vertices_local)->kind = DG;
    }
  }
  else if (kind == DN) {
    vertices_local = (Vertices)createGraph_CLG(vertices,edges,countOfVertex,countOfEdge,true);
    if ((ClgGraph)vertices_local != (ClgGraph)0x0) {
      ((ClgGraph)vertices_local)->kind = DN;
    }
  }
  else {
    vertices_local = (Vertices)0x0;
  }
  return (ClgGraph)vertices_local;
}

Assistant:

ClgGraph createClgGraph(Vertices vertices, Edges edges, int countOfVertex, int countOfEdge, GraphKind kind) {
    ClgGraph clgGraph = NULL;
    switch (kind) {
        case DG:
            clgGraph = createGraph_CLG(vertices, edges, countOfVertex, countOfEdge, false);
            if (clgGraph)
                clgGraph->kind = DG;
            return clgGraph;
        case DN:
            clgGraph = createGraph_CLG(vertices, edges, countOfVertex, countOfEdge, true);
            if (clgGraph)
                clgGraph->kind = DN;
            return clgGraph;
        default:
            return NULL;
    }

}